

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O2

void Abc_TgFlipSymGroupByVar(Abc_TgMan_t *pMan,int iVar)

{
  byte bVar1;
  int nWords;
  
  for (; -1 < iVar; iVar = (int)pMan->symLink[(uint)iVar]) {
    if (pMan->symPhase[(uint)iVar] != '\0') {
      nWords = 1 << ((char)pMan->nVars - 6U & 0x1f);
      if (pMan->nVars < 7) {
        nWords = 1;
      }
      bVar1 = pMan->pPermTRev[(uint)iVar];
      Abc_TtFlip(pMan->pTruth,nWords,(int)(char)bVar1);
      pMan->uPhase = pMan->uPhase ^ 1 << (bVar1 & 0x1f);
    }
  }
  return;
}

Assistant:

static inline void Abc_TgFlipSymGroupByVar(Abc_TgMan_t* pMan, int iVar)
{
    for (; iVar >= 0; iVar = pMan->symLink[iVar])
        if (pMan->symPhase[iVar])
            Abc_TgFlipVar(pMan, iVar);
}